

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall pbrt::ParameterDictionary::ReportUnused(ParameterDictionary *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *value;
  ParsedParameter **ppPVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  bool bVar4;
  _Alloc_hider _Var5;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar7;
  long lVar8;
  long lVar9;
  ParsedParameter *p;
  InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  seen;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  _Alloc_hider local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_140 [16];
  undefined8 local_40;
  long lStack_38;
  
  local_158._8_8_ = pstd::pmr::new_delete_resource();
  local_148._M_p = (pointer)0x0;
  local_40 = 0;
  lStack_38 = 0;
  paVar3 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  value = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)(local_168 + 8);
  paVar6 = &(this->params).field_2;
  if (paVar3 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar6 = paVar3;
  }
  ppPVar2 = paVar6->fixed + (this->params).nStored;
  do {
    if (paVar6 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)ppPVar2) {
      InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
      ::~InlinedVector((InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                        *)(local_158 + 8));
      return;
    }
    local_168._0_8_ = paVar6->fixed[0];
    if (((ParsedParameter *)local_168._0_8_)->mayBeUnused == false) {
      local_168._8_8_ = local_168;
      _Var5._M_p = local_148._M_p;
      if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)local_148._M_p ==
          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)0x0) {
        _Var5._M_p = (pointer)local_140;
      }
      lVar9 = lStack_38 * 0x10;
      ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *)((long)_Var5._M_p + lStack_38 * 0x10);
      for (lVar8 = lStack_38 >> 2;
          ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)_Var5._M_p, 0 < lVar8; lVar8 = lVar8 + -1) {
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)_Var5._M_p);
        if (bVar4) goto LAB_00280592;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)((long)_Var5._M_p + 0x10));
        ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)((long)_Var5._M_p + 0x10);
        if (bVar4) goto LAB_00280592;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)((long)_Var5._M_p + 0x20));
        ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)((long)_Var5._M_p + 0x20);
        if (bVar4) goto LAB_00280592;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)((long)_Var5._M_p + 0x30));
        ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)((long)_Var5._M_p + 0x30);
        if (bVar4) goto LAB_00280592;
        _Var5._M_p = _Var5._M_p + 0x40;
        lVar9 = lVar9 + -0x40;
      }
      lVar9 = lVar9 >> 4;
      if (lVar9 == 1) {
LAB_0028061d:
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)_Var5._M_p);
        ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)_Var5._M_p;
        if (!bVar4) {
          ppVar7 = ppVar1;
        }
      }
      else if (lVar9 == 2) {
LAB_002805f0:
        bVar4 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::
                operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)value,
                           ppVar7);
        if (!bVar4) {
          _Var5._M_p = (pointer)(ppVar7 + 1);
          goto LAB_0028061d;
        }
      }
      else {
        ppVar7 = ppVar1;
        if ((lVar9 == 3) &&
           (bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               value,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                      *)_Var5._M_p),
           ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                     *)_Var5._M_p, !bVar4)) {
          ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)((long)_Var5._M_p + 0x10);
          goto LAB_002805f0;
        }
      }
LAB_00280592:
      _Var5._M_p = local_148._M_p;
      if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)local_148._M_p ==
          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)0x0) {
        _Var5._M_p = (pointer)local_140;
      }
      if (*(bool *)(local_168._0_8_ + 0xb8) == true) {
        if (ppVar7 == (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                       *)((long)_Var5._M_p + lStack_38 * 0x10)) {
          local_168._8_8_ = local_168._0_8_;
          local_158._0_8_ = local_168._0_8_ + 0x20;
          InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          ::push_back((InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                       *)(local_158 + 8),value);
        }
      }
      else if (ppVar7 == (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)((long)_Var5._M_p + lStack_38 * 0x10)) {
        ErrorExit<std::__cxx11::string_const&>
                  ((FileLoc *)(local_168._0_8_ + 0x40),"\"%s\": unused parameter.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_168._0_8_ + 0x20));
      }
    }
    paVar6 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)((long)paVar6 + 8);
  } while( true );
}

Assistant:

void ParameterDictionary::ReportUnused() const {
    // type / name
    InlinedVector<std::pair<const std::string *, const std::string *>, 16> seen;

    for (const ParsedParameter *p : params) {
        if (p->mayBeUnused)
            continue;

        bool haveSeen =
            std::find_if(seen.begin(), seen.end(),
                         [&p](std::pair<const std::string *, const std::string *> p2) {
                             return *p2.first == p->type && *p2.second == p->name;
                         }) != seen.end();
        if (p->lookedUp) {
            // A parameter may be used when creating an initial Material, say,
            // but then an override from a Shape may shadow it such that its
            // name is already in the seen array.
            if (!haveSeen)
                seen.push_back(std::make_pair(&p->type, &p->name));
        } else if (haveSeen) {
            // It's shadowed by another parameter; that's fine.
        } else
            ErrorExit(&p->loc, "\"%s\": unused parameter.", p->name);
    }
}